

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_enum.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::EnumGenerator::GenerateHeader
          (EnumGenerator *this,Printer *printer)

{
  SourceLocation *this_00;
  EnumDescriptor *this_01;
  bool bVar1;
  uint uVar2;
  FileDescriptor *pFVar3;
  size_type sVar4;
  reference ppEVar5;
  char *pcVar6;
  long lVar7;
  undefined1 in_CL;
  undefined1 prefer_single_line;
  int i_00;
  EnumValueDescriptor *descriptor;
  string local_208;
  string local_1e8;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  string local_180 [8];
  string comments;
  SourceLocation location_1;
  undefined1 local_f0 [4];
  int i;
  string local_d0;
  undefined1 local_a0 [8];
  SourceLocation location;
  string enum_comments;
  Printer *printer_local;
  EnumGenerator *this_local;
  
  std::__cxx11::string::string
            ((string *)
             &location.leading_detached_comments.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  SourceLocation::SourceLocation((SourceLocation *)local_a0);
  bVar1 = EnumDescriptor::GetSourceLocation(this->descriptor_,(SourceLocation *)local_a0);
  if (bVar1) {
    BuildCommentsString_abi_cxx11_
              (&local_d0,(objectivec *)local_a0,(SourceLocation *)0x1,(bool)in_CL);
    std::__cxx11::string::operator=
              ((string *)
               &location.leading_detached_comments.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  else {
    std::__cxx11::string::operator=
              ((string *)
               &location.leading_detached_comments.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,"");
  }
  io::Printer::Print(printer,"#pragma mark - Enum $name$\n\n","name",&this->name_);
  this_01 = this->descriptor_;
  pFVar3 = EnumDescriptor::file(this_01);
  GetOptionalDeprecatedAttribute<google::protobuf::EnumDescriptor>
            ((string *)local_f0,this_01,pFVar3,true,false);
  io::Printer::Print(printer,"$comments$typedef$deprecated_attribute$ GPB_ENUM($name$) {\n",
                     "comments",
                     (string *)
                     &location.leading_detached_comments.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,"deprecated_attribute",
                     (string *)local_f0,"name",&this->name_);
  std::__cxx11::string::~string((string *)local_f0);
  io::Printer::Indent(printer);
  pFVar3 = EnumDescriptor::file(this->descriptor_);
  bVar1 = HasPreservingUnknownEnumSemantics(pFVar3);
  if (bVar1) {
    io::Printer::Print(printer,
                       "/**\n * Value used if any message\'s field encounters a value that is not defined\n * by this enum. The message will also have C functions to get/set the rawValue\n * of the field.\n **/\n$name$_GPBUnrecognizedEnumeratorValue = kGPBUnrecognizedEnumeratorValue,\n"
                       ,"name",&this->name_);
  }
  for (location_1.leading_detached_comments.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      sVar4 = std::
              vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ::size(&this->all_values_),
      (ulong)(long)location_1.leading_detached_comments.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < sVar4;
      location_1.leading_detached_comments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           location_1.leading_detached_comments.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    this_00 = (SourceLocation *)((long)&comments.field_2 + 8);
    SourceLocation::SourceLocation(this_00);
    prefer_single_line = (undefined1)sVar4;
    ppEVar5 = std::
              vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ::operator[](&this->all_values_,
                           (long)location_1.leading_detached_comments.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    bVar1 = EnumValueDescriptor::GetSourceLocation(*ppEVar5,this_00);
    if (bVar1) {
      BuildCommentsString_abi_cxx11_
                (&local_1a0,(objectivec *)(comments.field_2._M_local_buf + 8),(SourceLocation *)0x1,
                 (bool)prefer_single_line);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_180,pcVar6,&local_1a1);
      std::allocator<char>::~allocator(&local_1a1);
      std::__cxx11::string::~string((string *)&local_1a0);
      lVar7 = std::__cxx11::string::length();
      if (lVar7 != 0) {
        if (0 < location_1.leading_detached_comments.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
          io::Printer::Print(printer,"\n");
        }
        pcVar6 = (char *)std::__cxx11::string::c_str();
        io::Printer::Print(printer,pcVar6);
      }
      std::__cxx11::string::~string(local_180);
    }
    ppEVar5 = std::
              vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ::operator[](&this->all_values_,
                           (long)location_1.leading_detached_comments.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    EnumValueName_abi_cxx11_(&local_1c8,(objectivec *)*ppEVar5,descriptor);
    ppEVar5 = std::
              vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ::operator[](&this->all_values_,
                           (long)location_1.leading_detached_comments.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    GetOptionalDeprecatedAttribute<google::protobuf::EnumValueDescriptor>
              (&local_1e8,*ppEVar5,(FileDescriptor *)0x0,true,false);
    ppEVar5 = std::
              vector<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
              ::operator[](&this->all_values_,
                           (long)location_1.leading_detached_comments.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    uVar2 = EnumValueDescriptor::number(*ppEVar5);
    SimpleItoa_abi_cxx11_(&local_208,(protobuf *)(ulong)uVar2,i_00);
    io::Printer::Print(printer,"$name$$deprecated_attribute$ = $value$,\n","name",&local_1c8,
                       "deprecated_attribute",&local_1e8,"value",&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1c8);
    SourceLocation::~SourceLocation((SourceLocation *)((long)&comments.field_2 + 8));
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,
                     "};\n\nGPBEnumDescriptor *$name$_EnumDescriptor(void);\n\n/**\n * Checks to see if the given value is defined by the enum or was not known at\n * the time this source was generated.\n **/\nBOOL $name$_IsValidValue(int32_t value);\n\n"
                     ,"name",&this->name_);
  SourceLocation::~SourceLocation((SourceLocation *)local_a0);
  std::__cxx11::string::~string
            ((string *)
             &location.leading_detached_comments.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void EnumGenerator::GenerateHeader(io::Printer* printer) {
  string enum_comments;
  SourceLocation location;
  if (descriptor_->GetSourceLocation(&location)) {
    enum_comments = BuildCommentsString(location, true);
  } else {
    enum_comments = "";
  }

  printer->Print(
      "#pragma mark - Enum $name$\n"
      "\n",
      "name", name_);

  printer->Print("$comments$typedef$deprecated_attribute$ GPB_ENUM($name$) {\n",
                 "comments", enum_comments,
                 "deprecated_attribute", GetOptionalDeprecatedAttribute(descriptor_, descriptor_->file()),
                 "name", name_);
  printer->Indent();

  if (HasPreservingUnknownEnumSemantics(descriptor_->file())) {
    // Include the unknown value.
    printer->Print(
      "/**\n"
      " * Value used if any message's field encounters a value that is not defined\n"
      " * by this enum. The message will also have C functions to get/set the rawValue\n"
      " * of the field.\n"
      " **/\n"
      "$name$_GPBUnrecognizedEnumeratorValue = kGPBUnrecognizedEnumeratorValue,\n",
      "name", name_);
  }
  for (int i = 0; i < all_values_.size(); i++) {
    SourceLocation location;
    if (all_values_[i]->GetSourceLocation(&location)) {
      string comments = BuildCommentsString(location, true).c_str();
      if (comments.length() > 0) {
        if (i > 0) {
          printer->Print("\n");
        }
        printer->Print(comments.c_str());
      }
    }

    printer->Print(
        "$name$$deprecated_attribute$ = $value$,\n",
        "name", EnumValueName(all_values_[i]),
        "deprecated_attribute", GetOptionalDeprecatedAttribute(all_values_[i]),
        "value", SimpleItoa(all_values_[i]->number()));
  }
  printer->Outdent();
  printer->Print(
      "};\n"
      "\n"
      "GPBEnumDescriptor *$name$_EnumDescriptor(void);\n"
      "\n"
      "/**\n"
      " * Checks to see if the given value is defined by the enum or was not known at\n"
      " * the time this source was generated.\n"
      " **/\n"
      "BOOL $name$_IsValidValue(int32_t value);\n"
      "\n",
      "name", name_);
}